

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar-parser.cpp
# Opt level: O1

uint32_t grammar_parser::generate_symbol_id(parse_state *state,string *base_name)

{
  size_type *psVar1;
  uint __val;
  pointer pcVar2;
  bool bVar3;
  char cVar4;
  char cVar5;
  undefined8 *puVar6;
  mapped_type *pmVar7;
  uint uVar8;
  ulong uVar9;
  string __str_1;
  __string_type __str;
  ulong *local_80;
  uint local_78;
  undefined4 uStack_74;
  ulong local_70 [2];
  key_type local_60;
  ulong *local_40;
  ulong local_38;
  ulong local_30 [2];
  
  __val = (uint)(state->symbol_ids)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  pcVar2 = (base_name->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + base_name->_M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_40,local_38,0,'\x01');
  cVar5 = '\x01';
  if (9 < __val) {
    uVar8 = __val;
    cVar4 = '\x04';
    do {
      cVar5 = cVar4;
      if (uVar8 < 100) {
        cVar5 = cVar5 + -2;
        goto LAB_00176cf2;
      }
      if (uVar8 < 1000) {
        cVar5 = cVar5 + -1;
        goto LAB_00176cf2;
      }
      if (uVar8 < 10000) goto LAB_00176cf2;
      bVar3 = 99999 < uVar8;
      uVar8 = uVar8 / 10000;
      cVar4 = cVar5 + '\x04';
    } while (bVar3);
    cVar5 = cVar5 + '\x01';
  }
LAB_00176cf2:
  local_80 = local_70;
  std::__cxx11::string::_M_construct((ulong)&local_80,cVar5);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_80,local_78,__val);
  local_38 = CONCAT44(uStack_74,local_78) + local_38;
  uVar9 = 0xf;
  if (local_40 != local_30) {
    uVar9 = local_30[0];
  }
  if (uVar9 < local_38) {
    uVar9 = 0xf;
    if (local_80 != local_70) {
      uVar9 = local_70[0];
    }
    if (local_38 <= uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_80,0,(char *)0x0,(ulong)local_40);
      goto LAB_00176d75;
    }
  }
  puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_40,(ulong)local_80);
LAB_00176d75:
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60.field_2._8_8_ = puVar6[3];
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar1;
    local_60._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_60._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ::operator[](&state->symbol_ids,&local_60);
  *pmVar7 = __val;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return __val;
}

Assistant:

static uint32_t generate_symbol_id(parse_state & state, const std::string & base_name) {
        uint32_t next_id = static_cast<uint32_t>(state.symbol_ids.size());
        state.symbol_ids[base_name + '_' + std::to_string(next_id)] = next_id;
        return next_id;
    }